

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_number(lyxp_expr *exp,uint16_t *exp_idx,lyxp_set *set)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  longdouble in_ST0;
  char *local_40;
  char *endptr;
  longdouble num;
  lyxp_set *set_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  unique0x100002bc = set;
  set_local = (lyxp_set *)exp_idx;
  exp_idx_local = (uint16_t *)exp;
  if (set != (lyxp_set *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    strtold((char *)(*(long *)(exp_idx_local + 0x14) +
                    (ulong)*(ushort *)
                            (*(long *)(exp_idx_local + 4) +
                            (ulong)(ushort)(short)set_local->type * 2)),&local_40);
    _endptr = in_ST0;
    piVar4 = __errno_location();
    if (*piVar4 != 0) {
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
              *(long *)(exp_idx_local + 0x14) +
              (ulong)*(ushort *)
                      (*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2));
      bVar1 = *(byte *)(*(long *)(exp_idx_local + 8) + (ulong)(ushort)(short)set_local->type);
      lVar3 = *(long *)(exp_idx_local + 0x14);
      uVar2 = *(ushort *)(*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Failed to convert \"%.*s\" into a long double (%s).",(ulong)bVar1,
              lVar3 + (ulong)uVar2,pcVar5);
      return -1;
    }
    if ((long)local_40 -
        (*(long *)(exp_idx_local + 0x14) +
        (ulong)*(ushort *)(*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2)
        ) != (ulong)*(byte *)(*(long *)(exp_idx_local + 8) + (ulong)(ushort)(short)set_local->type))
    {
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
              *(long *)(exp_idx_local + 0x14) +
              (ulong)*(ushort *)
                      (*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2));
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Failed to convert \"%.*s\" into a long double.",
              (ulong)*(byte *)(*(long *)(exp_idx_local + 8) + (ulong)(ushort)(short)set_local->type)
              ,*(long *)(exp_idx_local + 0x14) +
               (ulong)*(ushort *)
                       (*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2));
      return -1;
    }
    set_fill_number(stack0xffffffffffffffd8,_endptr);
  }
  if ('\x02' < ly_log_level) {
    pcVar5 = "skipped";
    if (stack0xffffffffffffffd8 != (lyxp_set *)0x0) {
      pcVar5 = "parsed";
    }
    pcVar6 = print_token(*(lyxp_token *)
                          (*(long *)exp_idx_local + (ulong)(ushort)(short)set_local->type * 4));
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_number",pcVar5,pcVar6,
               (ulong)*(ushort *)
                       (*(long *)(exp_idx_local + 4) + (ulong)(ushort)(short)set_local->type * 2));
  }
  *(undefined2 *)&set_local->type = (short)set_local->type + LYXP_SET_NODE_SET;
  return 0;
}

Assistant:

static int
eval_number(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyxp_set *set)
{
    long double num;
    char *endptr;

    if (set) {
        errno = 0;
        num = strtold(&exp->expr[exp->expr_pos[*exp_idx]], &endptr);
        if (errno) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to convert \"%.*s\" into a long double (%s).",
                   exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]], strerror(errno));
            return -1;
        } else if (endptr - &exp->expr[exp->expr_pos[*exp_idx]] != exp->tok_len[*exp_idx]) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to convert \"%.*s\" into a long double.",
                   exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }

        set_fill_number(set, num);
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);
    return EXIT_SUCCESS;
}